

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O3

void __thiscall KDIS::KDataStream::Write<unsigned_long_long>(KDataStream *this,unsigned_long_long T)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [11];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  KUINT8 i;
  long lVar20;
  undefined1 auVar21 [16];
  uchar local_21;
  unsigned_long_long local_20;
  
  if (this->m_MachineEndian != this->m_NetEndian) {
    auVar9._8_6_ = 0;
    auVar9._0_8_ = T;
    auVar9[0xe] = (char)(T >> 0x38);
    auVar10._8_4_ = 0;
    auVar10._0_8_ = T;
    auVar10[0xc] = (char)(T >> 0x30);
    auVar10._13_2_ = auVar9._13_2_;
    auVar11._8_4_ = 0;
    auVar11._0_8_ = T;
    auVar11._12_3_ = auVar10._12_3_;
    auVar12._8_2_ = 0;
    auVar12._0_8_ = T;
    auVar12[10] = (char)(T >> 0x28);
    auVar12._11_4_ = auVar11._11_4_;
    auVar13._8_2_ = 0;
    auVar13._0_8_ = T;
    auVar13._10_5_ = auVar12._10_5_;
    auVar14[8] = (char)(T >> 0x20);
    auVar14._0_8_ = T;
    auVar14._9_6_ = auVar13._9_6_;
    auVar21[7] = 0;
    auVar21._0_7_ = auVar14._8_7_;
    auVar16._7_8_ = 0;
    auVar16._0_7_ = auVar14._8_7_;
    auVar18._1_8_ = SUB158(auVar16 << 0x40,7);
    auVar18[0] = (char)(T >> 0x18);
    auVar18._9_6_ = 0;
    auVar17._1_10_ = SUB1510(auVar18 << 0x30,5);
    auVar17[0] = (char)(T >> 0x10);
    auVar19._11_4_ = 0;
    auVar19._0_11_ = auVar17;
    auVar15._3_12_ = SUB1512(auVar19 << 0x20,3);
    auVar15[2] = (char)(T >> 8);
    auVar15[1] = 0;
    auVar15[0] = (byte)T;
    auVar21._8_4_ = auVar15._0_4_;
    auVar21._12_4_ = auVar17._0_4_;
    auVar21 = pshuflw(auVar21,auVar21,0x1b);
    auVar21 = pshufhw(auVar21,auVar21,0x1b);
    sVar1 = auVar21._0_2_;
    sVar2 = auVar21._2_2_;
    sVar3 = auVar21._4_2_;
    sVar4 = auVar21._6_2_;
    sVar5 = auVar21._8_2_;
    sVar6 = auVar21._10_2_;
    sVar7 = auVar21._12_2_;
    sVar8 = auVar21._14_2_;
    T = CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar21[0xe] - (0xff < sVar8),
                 CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar21[0xc] - (0xff < sVar7),
                          CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar21[10] - (0xff < sVar6),
                                   CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar21[8] -
                                            (0xff < sVar5),
                                            CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar21[6] -
                                                     (0xff < sVar4),
                                                     CONCAT12((0 < sVar3) * (sVar3 < 0x100) *
                                                              auVar21[4] - (0xff < sVar3),
                                                              CONCAT11((0 < sVar2) * (sVar2 < 0x100)
                                                                       * auVar21[2] - (0xff < sVar2)
                                                                       ,(0 < sVar1) *
                                                                        (sVar1 < 0x100) * auVar21[0]
                                                                        - (0xff < sVar1))))))));
  }
  local_20 = T;
  lVar20 = 0;
  do {
    local_21 = *(uchar *)((long)&local_20 + lVar20);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->m_vBuffer,&local_21);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 8);
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}